

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::prepareProgramInput
          (GeometryShaderMaxUniformComponentsTest *this)

{
  GLint GVar1;
  code *pcVar2;
  int iVar3;
  GLint GVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_00;
  reference pvVar8;
  int local_28;
  GLint i;
  Functions *gl;
  GeometryShaderMaxUniformComponentsTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
                      m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  GVar4 = (**(code **)(lVar7 + 0xb48))
                    ((this->super_GeometryShaderLimitsTransformFeedbackBase).m_program_object_id,
                     "uni_array");
  this->m_uniform_location = GVar4;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Failed to get uniform location",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x554);
  if (this->m_uniform_location == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid uniform location",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x558);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->m_uniform_data,(long)this->m_max_uniform_components);
  for (local_28 = 0; local_28 < this->m_max_uniform_components; local_28 = local_28 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_uniform_data,(long)local_28);
    *pvVar8 = local_28 + 1;
  }
  pcVar2 = *(code **)(lVar7 + 0x15b8);
  GVar4 = this->m_uniform_location;
  GVar1 = this->m_max_uniform_vectors;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_uniform_data,0);
  (*pcVar2)(GVar4,GVar1,pvVar8);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Failed to set uniform data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x569);
  return;
}

Assistant:

void GeometryShaderMaxUniformComponentsTest::prepareProgramInput()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Uniform location */
	m_uniform_location = gl.getUniformLocation(m_program_object_id, "uni_array");

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get uniform location");

	if (-1 == m_uniform_location)
	{
		TCU_FAIL("Invalid uniform location");
	}

	/* 3. Configure the uniforms to use subsequently increasing values, starting
	 *  from 1 for R component of first vector, 2 for G component of that vector,
	 *  5 for first component of second vector, and so on.
	 **/
	m_uniform_data.resize(m_max_uniform_components);

	for (glw::GLint i = 0; i < m_max_uniform_components; ++i)
	{
		m_uniform_data[i] = i + 1;
	}

	/* Set uniform data */
	gl.uniform4iv(m_uniform_location, m_max_uniform_vectors, &m_uniform_data[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform data");
}